

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strtok.c
# Opt level: O0

char * uv__strtok(char *str,char *sep,char **itr)

{
  char *start;
  char *tmp;
  char *sep_itr;
  char **itr_local;
  char *sep_local;
  char *str_local;
  
  start = str;
  if (str == (char *)0x0) {
    start = *itr;
  }
  str_local = start;
  if (start == (char *)0x0) {
    str_local = (char *)0x0;
  }
  else {
    for (; tmp = sep, *start != '\0'; start = start + 1) {
      for (; *tmp != '\0'; tmp = tmp + 1) {
        if (*start == *tmp) {
          *itr = start + 1;
          *start = '\0';
          return str_local;
        }
      }
    }
    *itr = (char *)0x0;
  }
  return str_local;
}

Assistant:

char* uv__strtok(char* str, const char* sep, char** itr) {
  const char* sep_itr;
  char* tmp;
  char* start;

  if (str == NULL)
    start = tmp = *itr;
  else
    start = tmp = str;

  if (tmp == NULL)
    return NULL;

  while (*tmp != '\0') {
    sep_itr = sep;
    while (*sep_itr != '\0') {
      if (*tmp == *sep_itr) {
        *itr = tmp + 1;
        *tmp = '\0';
        return start;
      }
      sep_itr++;
    }
    tmp++;
  }
  *itr = NULL;
  return start;
}